

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_mwhere(CHAR_DATA *ch,char *argument)

{
  char cVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  BUFFER *buffer;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  CHAR_DATA *pCVar10;
  DESCRIPTOR_DATA *pDVar11;
  char buf [4608];
  undefined8 in_stack_ffffffffffffed98;
  undefined4 uVar12;
  uint local_1254;
  char local_1238 [4616];
  
  cVar1 = *argument;
  buffer = new_buf();
  if (cVar1 == '\0') {
    if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
      uVar9 = 0;
      pDVar11 = descriptor_list;
      do {
        pCVar10 = pDVar11->character;
        if ((((pCVar10 != (CHAR_DATA *)0x0) && (pDVar11->connected == 0)) &&
            (pCVar10->in_room != (ROOM_INDEX_DATA *)0x0)) && (bVar4 = can_see(ch,pCVar10), bVar4)) {
          bVar4 = can_see_room(ch,pDVar11->character->in_room);
          uVar12 = (undefined4)((ulong)in_stack_ffffffffffffed98 >> 0x20);
          if (bVar4) {
            pCVar10 = pDVar11->character;
            uVar9 = uVar9 + 1;
            if (pDVar11->original == (CHAR_DATA *)0x0) {
              bVar4 = is_npc(pCVar10);
              pcVar6 = (&pCVar10->name)[!bVar4];
              pcVar5 = get_room_name(pCVar10->in_room);
              sprintf(local_1238,"%3d) %s is in %s [%d]\n\r",(ulong)uVar9,pcVar6,pcVar5,
                      (ulong)(uint)(int)pCVar10->in_room->vnum);
            }
            else {
              pcVar6 = pDVar11->original->true_name;
              pcVar5 = pCVar10->short_descr;
              pcVar7 = get_room_name(pCVar10->in_room);
              in_stack_ffffffffffffed98 = CONCAT44(uVar12,(int)pCVar10->in_room->vnum);
              sprintf(local_1238,"%3d) %s (in the body of %s) is in %s [%d]\n\r",(ulong)uVar9,pcVar6
                      ,pcVar5,pcVar7,in_stack_ffffffffffffed98);
            }
            add_buf(buffer,local_1238);
          }
        }
        pDVar11 = pDVar11->next;
      } while (pDVar11 != (DESCRIPTOR_DATA *)0x0);
    }
    pcVar6 = buf_string(buffer);
LAB_002711f9:
    page_to_char(pcVar6,ch);
  }
  else {
    if (char_list != (CHAR_DATA *)0x0) {
      bVar4 = false;
      local_1254 = 0;
      pCVar10 = char_list;
      do {
        if (((pCVar10->in_room != (ROOM_INDEX_DATA *)0x0) && (bVar3 = can_see(ch,pCVar10), bVar3))
           && (bVar3 = is_name(argument,pCVar10->name), bVar3)) {
          bVar4 = is_npc(pCVar10);
          uVar8 = 0;
          if (bVar4) {
            uVar8 = (ulong)(uint)(int)pCVar10->pIndexData->vnum;
          }
          local_1254 = local_1254 + 1;
          bVar4 = is_npc(pCVar10);
          pcVar6 = (&pCVar10->name)[(ulong)bVar4 * 4];
          sVar2 = pCVar10->in_room->vnum;
          pcVar5 = get_room_name(pCVar10->in_room);
          sprintf(local_1238,"%3d) [%5d] %-28s [%5d] %s\n\r",(ulong)local_1254,uVar8,pcVar6,
                  (ulong)(uint)(int)sVar2,pcVar5);
          add_buf(buffer,local_1238);
          bVar4 = true;
        }
        pCVar10 = pCVar10->next;
      } while (pCVar10 != (CHAR_DATA *)0x0);
      if (bVar4) {
        pcVar6 = buf_string(buffer);
        goto LAB_002711f9;
      }
    }
    act("You didn\'t find any $T.",ch,(void *)0x0,argument,3);
  }
  free_buf(buffer);
  return;
}

Assistant:

void do_mwhere(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	BUFFER *buffer;
	CHAR_DATA *victim;
	bool found;
	int count = 0;

	if (argument[0] == '\0')
	{
		DESCRIPTOR_DATA *d;

		/* show characters logged */

		buffer = new_buf();
		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			if (d->character != nullptr
				&& d->connected == CON_PLAYING
				&& d->character->in_room != nullptr
				&& can_see(ch, d->character)
				&& can_see_room(ch, d->character->in_room))
			{
				victim = d->character;
				count++;

				if (d->original != nullptr)
				{
					sprintf(buf, "%3d) %s (in the body of %s) is in %s [%d]\n\r",
						count,
						d->original->true_name,
						victim->short_descr,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}
				else
				{
					sprintf(buf, "%3d) %s is in %s [%d]\n\r",
						count,
						is_npc(victim) ? victim->name : victim->true_name,
						get_room_name(victim->in_room),
						victim->in_room->vnum);
				}

				add_buf(buffer, buf);
			}
		}

		page_to_char(buf_string(buffer), ch);
		free_buf(buffer);
		return;
	}

	found = false;
	buffer = new_buf();

	for (victim = char_list; victim != nullptr; victim = victim->next)
	{
		if (victim->in_room != nullptr && can_see(ch, victim) && is_name(argument, victim->name))
		{
			found = true;
			count++;

			sprintf(buf, "%3d) [%5d] %-28s [%5d] %s\n\r",
				count,
				is_npc(victim) ? victim->pIndexData->vnum : 0,
				is_npc(victim) ? victim->short_descr : victim->name,
				victim->in_room->vnum,
				get_room_name(victim->in_room));
			add_buf(buffer, buf);
		}
	}

	if (!found)
		act("You didn't find any $T.", ch, nullptr, argument, TO_CHAR);
	else
		page_to_char(buf_string(buffer), ch);

	free_buf(buffer);
}